

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O0

void __thiscall argsman_tests::util_GetBoolArg::test_method(util_GetBoolArg *this)

{
  char cVar1;
  initializer_list<char> __l;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_00;
  bool bVar2;
  size_type sVar3;
  long in_FS_OFFSET;
  pair<const_char_*,_ArgsManager::Flags> pVar4;
  char opt;
  char *__end1;
  char *__begin1;
  char (*__range1) [7];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  pair<const_char_*,_ArgsManager::Flags> f;
  pair<const_char_*,_ArgsManager::Flags> e;
  pair<const_char_*,_ArgsManager::Flags> d;
  pair<const_char_*,_ArgsManager::Flags> c;
  pair<const_char_*,_ArgsManager::Flags> b;
  pair<const_char_*,_ArgsManager::Flags> a;
  string error;
  char *argv_test [7];
  TestArgsManager testArgs;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_fffffffffffff128;
  undefined7 in_stack_fffffffffffff130;
  undefined1 in_stack_fffffffffffff137;
  undefined7 in_stack_fffffffffffff138;
  undefined1 in_stack_fffffffffffff13f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff140;
  undefined4 in_stack_fffffffffffff148;
  int in_stack_fffffffffffff14c;
  ArgsManager *in_stack_fffffffffffff150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff158;
  size_t line_num;
  undefined7 in_stack_fffffffffffff160;
  undefined1 in_stack_fffffffffffff167;
  lazy_ostream *in_stack_fffffffffffff168;
  undefined7 in_stack_fffffffffffff170;
  undefined1 in_stack_fffffffffffff177;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *in_stack_fffffffffffff1e0;
  undefined7 in_stack_fffffffffffff1e8;
  undefined1 in_stack_fffffffffffff1ef;
  undefined8 in_stack_fffffffffffff1f0;
  ArgsManager *in_stack_fffffffffffff1f8;
  undefined1 *local_cc0;
  char *local_c28;
  const_string local_be8 [2];
  lazy_ostream local_bc8 [2];
  undefined1 local_ba1 [57];
  const_string local_b68 [2];
  lazy_ostream local_b48 [2];
  undefined1 local_b21 [57];
  const_string local_ae8 [2];
  lazy_ostream local_ac8 [2];
  allocator<char> local_aa1;
  assertion_result local_aa0 [2];
  const_string local_a68 [2];
  lazy_ostream local_a48 [2];
  allocator<char> local_a21;
  assertion_result local_a20 [2];
  const_string local_9e8 [2];
  lazy_ostream local_9c8 [2];
  allocator<char> local_9a1;
  assertion_result local_9a0 [2];
  const_string local_968 [2];
  lazy_ostream local_948 [2];
  allocator<char> local_921;
  assertion_result local_920 [2];
  const_string local_8e8 [2];
  lazy_ostream local_8c8 [2];
  allocator<char> local_8a1;
  assertion_result local_8a0 [2];
  const_string local_868 [2];
  lazy_ostream local_848 [2];
  allocator<char> local_821;
  assertion_result local_820 [2];
  const_string local_7e8 [2];
  lazy_ostream local_7c8 [2];
  allocator<char> local_7a1;
  assertion_result local_7a0 [2];
  const_string local_768 [2];
  lazy_ostream local_748 [2];
  assertion_result local_728 [2];
  const_string local_6f0 [2];
  lazy_ostream local_6d0 [2];
  allocator<char> local_6a9;
  assertion_result local_6a8 [2];
  const_string local_670 [2];
  lazy_ostream local_650 [2];
  assertion_result local_630 [3];
  char *local_5d8;
  Flags local_5d0;
  undefined4 local_5c4;
  char *local_5c0;
  Flags local_5b8;
  undefined4 local_5ac;
  char *local_5a8;
  Flags local_5a0;
  undefined4 local_594;
  char *local_590;
  Flags local_588;
  undefined4 local_57c;
  char *local_578;
  Flags local_570;
  undefined4 local_564;
  char *local_560;
  Flags local_558;
  undefined4 local_550;
  undefined1 local_54a;
  char local_549;
  char *local_538;
  Flags local_530;
  char *local_528;
  Flags local_520;
  char *local_518;
  Flags local_510;
  char *local_508;
  Flags local_500;
  char *local_4f8;
  Flags local_4f0;
  char *local_4e8;
  Flags local_4e0;
  undefined1 local_398 [240];
  undefined1 local_2a8 [32];
  char *local_288;
  char *pcStack_280;
  char *local_278;
  char *pcStack_270;
  char *local_268;
  char *pcStack_260;
  char *local_258;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TestArgsManager::TestArgsManager((TestArgsManager *)in_stack_fffffffffffff128);
  local_550 = 1;
  pVar4 = std::make_pair<char_const(&)[3],ArgsManager::Flags>
                    ((char (*) [3])in_stack_fffffffffffff140,
                     (Flags *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138));
  local_560 = pVar4.first;
  local_558 = pVar4.second;
  local_564 = 1;
  local_4e8 = local_560;
  local_4e0 = local_558;
  pVar4 = std::make_pair<char_const(&)[3],ArgsManager::Flags>
                    ((char (*) [3])in_stack_fffffffffffff140,
                     (Flags *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138));
  local_578 = pVar4.first;
  local_570 = pVar4.second;
  local_57c = 1;
  local_4f8 = local_578;
  local_4f0 = local_570;
  pVar4 = std::make_pair<char_const(&)[3],ArgsManager::Flags>
                    ((char (*) [3])in_stack_fffffffffffff140,
                     (Flags *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138));
  local_590 = pVar4.first;
  local_588 = pVar4.second;
  local_594 = 1;
  local_508 = local_590;
  local_500 = local_588;
  pVar4 = std::make_pair<char_const(&)[3],ArgsManager::Flags>
                    ((char (*) [3])in_stack_fffffffffffff140,
                     (Flags *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138));
  local_5a8 = pVar4.first;
  local_5a0 = pVar4.second;
  local_5ac = 1;
  local_518 = local_5a8;
  local_510 = local_5a0;
  pVar4 = std::make_pair<char_const(&)[3],ArgsManager::Flags>
                    ((char (*) [3])in_stack_fffffffffffff140,
                     (Flags *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138));
  local_5c0 = pVar4.first;
  local_5b8 = pVar4.second;
  local_5c4 = 1;
  local_528 = local_5c0;
  local_520 = local_5b8;
  pVar4 = std::make_pair<char_const(&)[3],ArgsManager::Flags>
                    ((char (*) [3])in_stack_fffffffffffff140,
                     (Flags *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138));
  local_5d8 = pVar4.first;
  local_5d0 = pVar4.second;
  local_258 = "-f=true";
  local_268 = "-d=1";
  pcStack_260 = "-e=false";
  local_278 = "-nob";
  pcStack_270 = "-c=0";
  local_288 = "ignored";
  pcStack_280 = "-a";
  local_538 = local_5d8;
  local_530 = local_5d0;
  std::__cxx11::string::string(in_stack_fffffffffffff140);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff128);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff168,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
             (char *)in_stack_fffffffffffff158,(char *)in_stack_fffffffffffff150,
             in_stack_fffffffffffff14c,SUB41((uint)in_stack_fffffffffffff148 >> 0x18,0));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_fffffffffffff158);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_fffffffffffff158);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_fffffffffffff158);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_fffffffffffff158);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_fffffffffffff158);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_fffffffffffff158);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)in_stack_fffffffffffff128);
  __l_00._M_array._7_1_ = in_stack_fffffffffffff177;
  __l_00._M_array._0_7_ = in_stack_fffffffffffff170;
  __l_00._M_len = (size_type)in_stack_fffffffffffff178;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_fffffffffffff168,__l_00,
           (allocator_type *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160));
  TestArgsManager::SetupArgs
            ((TestArgsManager *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)in_stack_fffffffffffff168);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138));
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)in_stack_fffffffffffff128);
  local_cc0 = local_2a8;
  do {
    local_cc0 = local_cc0 + -0x28;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair(in_stack_fffffffffffff128);
  } while (local_cc0 != local_398);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff168,
               (const_string *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
               (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
    ArgsManager::ParseParameters
              (in_stack_fffffffffffff1f8,(int)((ulong)in_stack_fffffffffffff1f0 >> 0x20),
               (char **)CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8),
               in_stack_fffffffffffff1e0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (bool)in_stack_fffffffffffff137);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    in_stack_fffffffffffff128 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_630,local_650,local_670,0x150,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff128);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff128);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  for (local_c28 = "abcdef";
      local_c28 !=
      "get_valid_opts({(\"-assumevalid=\" + assume_valid).c_str()}).assumed_valid_block";
      local_c28 = local_c28 + 1) {
    cVar1 = *local_c28;
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
                 (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      local_54a = 0x2d;
      local_549 = cVar1;
      std::allocator<char>::allocator();
      __l._M_array._7_1_ = in_stack_fffffffffffff167;
      __l._M_array._0_7_ = in_stack_fffffffffffff160;
      __l._M_len = (size_type)in_stack_fffffffffffff168;
      std::__cxx11::string::string
                (in_stack_fffffffffffff158,__l,(allocator<char> *)in_stack_fffffffffffff150);
      ArgsManager::IsArgSet
                (in_stack_fffffffffffff150,
                 (string *)CONCAT44(in_stack_fffffffffffff14c,in_stack_fffffffffffff148));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
                 (bool)in_stack_fffffffffffff137);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
                 (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
                 (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                 (unsigned_long)in_stack_fffffffffffff128);
      in_stack_fffffffffffff128 =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_6a8,local_6d0,local_6f0,0x154,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff128);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff128);
      std::__cxx11::string::~string(&in_stack_fffffffffffff128->first);
      std::allocator<char>::~allocator(&local_6a9);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff168,
               (const_string *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
               (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
            ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                    *)in_stack_fffffffffffff128);
    if (sVar3 == 6) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
      ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
               *)in_stack_fffffffffffff128);
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (bool)in_stack_fffffffffffff137);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    in_stack_fffffffffffff128 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_728,local_748,local_768,0x158,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff128);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff128);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff168,
               (const_string *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
               (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff178,
               (char *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
               (allocator<char> *)in_stack_fffffffffffff168);
    ArgsManager::IsArgSet
              (in_stack_fffffffffffff150,
               (string *)CONCAT44(in_stack_fffffffffffff14c,in_stack_fffffffffffff148));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (bool)in_stack_fffffffffffff137);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    in_stack_fffffffffffff128 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7a0,local_7c8,local_7e8,0x15b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff128);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff128);
    std::__cxx11::string::~string(&in_stack_fffffffffffff128->first);
    std::allocator<char>::~allocator(&local_7a1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff168,
               (const_string *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
               (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff178,
               (char *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
               (allocator<char> *)in_stack_fffffffffffff168);
    ArgsManager::IsArgNegated
              (in_stack_fffffffffffff150,
               (string *)CONCAT44(in_stack_fffffffffffff14c,in_stack_fffffffffffff148));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (bool)in_stack_fffffffffffff137);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    in_stack_fffffffffffff128 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_820,local_848,local_868,0x15e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff128);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff128);
    std::__cxx11::string::~string(&in_stack_fffffffffffff128->first);
    std::allocator<char>::~allocator(&local_821);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff168,
               (const_string *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
               (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff178,
               (char *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
               (allocator<char> *)in_stack_fffffffffffff168);
    ArgsManager::IsArgNegated
              (in_stack_fffffffffffff150,
               (string *)CONCAT44(in_stack_fffffffffffff14c,in_stack_fffffffffffff148));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (bool)in_stack_fffffffffffff137);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    in_stack_fffffffffffff128 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8a0,local_8c8,local_8e8,0x15f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff128);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff128);
    std::__cxx11::string::~string(&in_stack_fffffffffffff128->first);
    std::allocator<char>::~allocator(&local_8a1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff168,
               (const_string *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
               (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff178,
               (char *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
               (allocator<char> *)in_stack_fffffffffffff168);
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               &in_stack_fffffffffffff128->first,(bool)in_stack_fffffffffffff13f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (bool)in_stack_fffffffffffff137);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    in_stack_fffffffffffff128 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_920,local_948,local_968,0x162,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff128);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff128);
    std::__cxx11::string::~string(&in_stack_fffffffffffff128->first);
    std::allocator<char>::~allocator(&local_921);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff168,
               (const_string *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
               (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff178,
               (char *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
               (allocator<char> *)in_stack_fffffffffffff168);
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               &in_stack_fffffffffffff128->first,(bool)in_stack_fffffffffffff13f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (bool)in_stack_fffffffffffff137);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    in_stack_fffffffffffff128 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9a0,local_9c8,local_9e8,0x163,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff128);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff128);
    std::__cxx11::string::~string(&in_stack_fffffffffffff128->first);
    std::allocator<char>::~allocator(&local_9a1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff168,
               (const_string *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
               (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff178,
               (char *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
               (allocator<char> *)in_stack_fffffffffffff168);
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               &in_stack_fffffffffffff128->first,(bool)in_stack_fffffffffffff13f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (bool)in_stack_fffffffffffff137);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    in_stack_fffffffffffff128 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a20,local_a48,local_a68,0x164,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff128);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff128);
    std::__cxx11::string::~string(&in_stack_fffffffffffff128->first);
    std::allocator<char>::~allocator(&local_a21);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff168,
               (const_string *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
               (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff178,
               (char *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
               (allocator<char> *)in_stack_fffffffffffff168);
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               &in_stack_fffffffffffff128->first,(bool)in_stack_fffffffffffff13f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (bool)in_stack_fffffffffffff137);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    in_stack_fffffffffffff128 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_aa0,local_ac8,local_ae8,0x165,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff128);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff128);
    std::__cxx11::string::~string(&in_stack_fffffffffffff128->first);
    std::allocator<char>::~allocator(&local_aa1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff168,
               (const_string *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
               (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b21;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
               (allocator<char> *)in_stack_fffffffffffff168);
    in_stack_fffffffffffff177 =
         ArgsManager::GetBoolArg
                   ((ArgsManager *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
                    &in_stack_fffffffffffff128->first,(bool)in_stack_fffffffffffff13f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (bool)in_stack_fffffffffffff137);
    in_stack_fffffffffffff168 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    in_stack_fffffffffffff128 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)(local_b21 + 1),local_b48,local_b68,0x166,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff128);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff128);
    std::__cxx11::string::~string(&in_stack_fffffffffffff128->first);
    std::allocator<char>::~allocator((allocator<char> *)local_b21);
    in_stack_fffffffffffff167 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff167);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff168,
               (const_string *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
               line_num,(const_string *)in_stack_fffffffffffff150);
    in_stack_fffffffffffff150 = (ArgsManager *)local_ba1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
               (allocator<char> *)in_stack_fffffffffffff168);
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               &in_stack_fffffffffffff128->first,(bool)in_stack_fffffffffffff13f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (bool)in_stack_fffffffffffff137);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
               (pointer)CONCAT17(in_stack_fffffffffffff137,in_stack_fffffffffffff130),
               (unsigned_long)in_stack_fffffffffffff128);
    in_stack_fffffffffffff128 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)(local_ba1 + 1),local_bc8,local_be8,0x167,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff128);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff128);
    std::__cxx11::string::~string(&in_stack_fffffffffffff128->first);
    std::allocator<char>::~allocator((allocator<char> *)local_ba1);
    in_stack_fffffffffffff13f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff13f);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff128);
  std::__cxx11::string::~string(&in_stack_fffffffffffff128->first);
  TestArgsManager::~TestArgsManager((TestArgsManager *)in_stack_fffffffffffff128);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_GetBoolArg)
{
    TestArgsManager testArgs;
    const auto a = std::make_pair("-a", ArgsManager::ALLOW_ANY);
    const auto b = std::make_pair("-b", ArgsManager::ALLOW_ANY);
    const auto c = std::make_pair("-c", ArgsManager::ALLOW_ANY);
    const auto d = std::make_pair("-d", ArgsManager::ALLOW_ANY);
    const auto e = std::make_pair("-e", ArgsManager::ALLOW_ANY);
    const auto f = std::make_pair("-f", ArgsManager::ALLOW_ANY);

    const char *argv_test[] = {
        "ignored", "-a", "-nob", "-c=0", "-d=1", "-e=false", "-f=true"};
    std::string error;
    LOCK(testArgs.cs_args);
    testArgs.SetupArgs({a, b, c, d, e, f});
    BOOST_CHECK(testArgs.ParseParameters(7, argv_test, error));

    // Each letter should be set.
    for (const char opt : "abcdef")
        BOOST_CHECK(testArgs.IsArgSet({'-', opt}) || !opt);

    // Nothing else should be in the map
    BOOST_CHECK(testArgs.m_settings.command_line_options.size() == 6 &&
                testArgs.m_settings.ro_config.empty());

    // The -no prefix should get stripped on the way in.
    BOOST_CHECK(!testArgs.IsArgSet("-nob"));

    // The -b option is flagged as negated, and nothing else is
    BOOST_CHECK(testArgs.IsArgNegated("-b"));
    BOOST_CHECK(!testArgs.IsArgNegated("-a"));

    // Check expected values.
    BOOST_CHECK(testArgs.GetBoolArg("-a", false) == true);
    BOOST_CHECK(testArgs.GetBoolArg("-b", true) == false);
    BOOST_CHECK(testArgs.GetBoolArg("-c", true) == false);
    BOOST_CHECK(testArgs.GetBoolArg("-d", false) == true);
    BOOST_CHECK(testArgs.GetBoolArg("-e", true) == false);
    BOOST_CHECK(testArgs.GetBoolArg("-f", true) == false);
}